

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto(EnumDescriptorProto *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffa8;
  InternalMetadataWithArena *in_stack_ffffffffffffffb0;
  EnumDescriptorProto *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__EnumDescriptorProto_008da970;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x4fec92);
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)0x4feca5);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)0x4fecba);
  this_00 = (EnumDescriptorProto *)(in_RDI + 9);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x4feccf);
  SharedCtor(this_00);
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.EnumDescriptorProto)
}